

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gost89.c
# Opt level: O0

void hexdump(FILE *f,char *title,uchar *s,int l)

{
  int in_ECX;
  long in_RDX;
  undefined8 in_RSI;
  FILE *in_RDI;
  int n;
  uint local_20;
  
  local_20 = 0;
  fprintf(in_RDI,"%s",in_RSI);
  for (; (int)local_20 < in_ECX; local_20 = local_20 + 1) {
    if ((int)local_20 % 0x10 == 0) {
      fprintf(in_RDI,"\n%04x",(ulong)local_20);
    }
    fprintf(in_RDI," %02x",(ulong)*(byte *)(in_RDX + (int)local_20));
  }
  fprintf(in_RDI,"\n");
  return;
}

Assistant:

static void hexdump(FILE *f, const char *title, const unsigned char *s, int l)
{
    int n = 0;

    fprintf(f, "%s", title);
    for (; n < l; ++n) {
        if ((n % 16) == 0)
            fprintf(f, "\n%04x", n);
        fprintf(f, " %02x", s[n]);
    }
    fprintf(f, "\n");
}